

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O2

char * match(MatchState *ms,char *s,char *p)

{
  int *piVar1;
  byte bVar2;
  int iVar3;
  uint uVar4;
  byte *pbVar5;
  ulong uVar6;
  ptrdiff_t *ppVar7;
  byte *pbVar8;
  byte *s_00;
  long lVar9;
  byte *pbVar10;
  
  piVar1 = &ms->matchdepth;
  iVar3 = *piVar1;
  *piVar1 = *piVar1 + -1;
  if (iVar3 == 0) {
    luaL_error(ms->L,"pattern too complex");
  }
LAB_0011c017:
  s_00 = (byte *)s + 1;
  pbVar8 = (byte *)p;
LAB_0011c01f:
  pbVar10 = (byte *)ms->p_end;
  pbVar5 = (byte *)s;
  if (pbVar8 == pbVar10) goto LAB_0011c320;
  switch(*pbVar8) {
  case 0x24:
    if (pbVar8 + 1 == pbVar10) {
      pbVar5 = (byte *)0x0;
      if (s == ms->src_end) {
        pbVar5 = (byte *)s;
      }
      goto LAB_0011c320;
    }
    break;
  case 0x25:
    bVar2 = pbVar8[1];
    if (bVar2 == 0x66) goto code_r0x0011c056;
    if (9 < bVar2 - 0x30) {
      if (bVar2 != 0x62) break;
      if (pbVar10 + -1 <= pbVar8 + 2) {
        luaL_error(ms->L,"malformed pattern (missing arguments to \'%%b\')");
      }
      if (*s != pbVar8[2]) goto LAB_0011c305;
      iVar3 = 1;
      goto LAB_0011c224;
    }
    if (((bVar2 < 0x31) || (uVar4 = bVar2 - 0x31, ms->level <= uVar4)) ||
       (ms->capture[uVar4].len == -1)) {
      uVar4 = luaL_error(ms->L,"invalid capture index %%%d");
    }
    uVar6 = ms->capture[(int)uVar4].len;
    if (((ulong)((long)ms->src_end - (long)s) < uVar6) ||
       (iVar3 = bcmp(ms->capture[(int)uVar4].init,s,uVar6), iVar3 != 0)) goto LAB_0011c305;
    pbVar5 = (byte *)0x0;
    if ((byte *)s == (byte *)0x0) goto LAB_0011c320;
    s = (char *)((byte *)s + uVar6);
    p = (char *)(pbVar8 + 2);
    goto LAB_0011c017;
  case 0x28:
    if (pbVar8[1] == 0x29) {
      pbVar8 = pbVar8 + 2;
      iVar3 = -2;
    }
    else {
      pbVar8 = pbVar8 + 1;
      iVar3 = -1;
    }
    pbVar5 = (byte *)start_capture(ms,s,(char *)pbVar8,iVar3);
    goto LAB_0011c320;
  case 0x29:
    uVar6 = (ulong)ms->level;
    ppVar7 = &ms->capture[(ulong)ms->level - 1].len;
    goto LAB_0011c2b0;
  }
  p = classend(ms,(char *)pbVar8);
  iVar3 = singlematch(ms,s,(char *)pbVar8,p);
  bVar2 = *p;
  if (iVar3 == 0) {
    if (0x3f < bVar2) goto LAB_0011c305;
    pbVar5 = (byte *)0x0;
    if ((0x8000240000000000U >> ((ulong)bVar2 & 0x3f) & 1) == 0) goto LAB_0011c320;
    pbVar8 = (byte *)p + 1;
    goto LAB_0011c01f;
  }
  if (bVar2 == 0x3f) {
    pbVar5 = (byte *)match(ms,(char *)s_00,(char *)((byte *)p + 1));
    pbVar8 = (byte *)p + 1;
    if (pbVar5 != (byte *)0x0) goto LAB_0011c320;
    goto LAB_0011c01f;
  }
  if (bVar2 != 0x2a) {
    if (bVar2 != 0x2b) {
      if (bVar2 == 0x2d) {
        goto LAB_0011c384;
      }
      s = (char *)((byte *)s + 1);
      goto LAB_0011c017;
    }
    s = (char *)((byte *)s + 1);
  }
  lVar9 = -1;
  do {
    iVar3 = singlematch(ms,(char *)((byte *)s + lVar9 + 1),(char *)pbVar8,p);
    lVar9 = lVar9 + 1;
  } while (iVar3 != 0);
  while (-1 < lVar9) {
    pbVar5 = (byte *)match(ms,(char *)((byte *)s + lVar9),(char *)((byte *)p + 1));
    lVar9 = lVar9 + -1;
    if (pbVar5 != (byte *)0x0) goto LAB_0011c320;
  }
  goto LAB_0011c305;
  while( true ) {
    uVar6 = uVar6 - 1;
    lVar9 = *ppVar7;
    ppVar7 = ppVar7 + -2;
    if (lVar9 == -1) break;
LAB_0011c2b0:
    if ((long)uVar6 < 1) {
      uVar4 = luaL_error(ms->L,"invalid pattern capture");
      uVar6 = (ulong)uVar4;
      break;
    }
  }
  iVar3 = (int)uVar6;
  ms->capture[iVar3].len = (long)s - (long)ms->capture[iVar3].init;
  pbVar5 = (byte *)match(ms,s,(char *)(pbVar8 + 1));
  if (pbVar5 == (byte *)0x0) {
    ms->capture[iVar3].len = -1;
LAB_0011c305:
    pbVar5 = (byte *)0x0;
  }
  goto LAB_0011c320;
code_r0x0011c056:
  if (pbVar8[2] != 0x5b) {
    luaL_error(ms->L,"missing \'[\' after \'%%f\' in pattern");
  }
  pbVar10 = pbVar8 + 2;
  pbVar8 = (byte *)classend(ms,(char *)pbVar10);
  if (s == ms->src_init) {
    uVar4 = 0;
  }
  else {
    uVar4 = (uint)((byte *)s)[-1];
  }
  iVar3 = matchbracketclass(uVar4,(char *)pbVar10,(char *)(pbVar8 + -1));
  if ((iVar3 != 0) ||
     (iVar3 = matchbracketclass((uint)(byte)*s,(char *)pbVar10,(char *)(pbVar8 + -1)), iVar3 == 0))
  goto LAB_0011c305;
  goto LAB_0011c01f;
LAB_0011c224:
  if (ms->src_end <= s_00) goto LAB_0011c305;
  if (*s_00 == pbVar8[3]) {
    iVar3 = iVar3 + -1;
    if (iVar3 == 0) goto LAB_0011c24d;
  }
  else {
    iVar3 = iVar3 + (uint)(*s_00 == *s);
  }
  s_00 = s_00 + 1;
  goto LAB_0011c224;
LAB_0011c24d:
  s = (char *)(s_00 + 1);
  p = (char *)(pbVar8 + 4);
  goto LAB_0011c017;
  while( true ) {
    iVar3 = singlematch(ms,s,(char *)pbVar8,p);
    s = (char *)((byte *)s + 1);
    pbVar5 = (byte *)0x0;
    if (iVar3 == 0) break;
LAB_0011c384:
    pbVar5 = (byte *)match(ms,s,(char *)((byte *)p + 1));
    if (pbVar5 != (byte *)0x0) break;
  }
LAB_0011c320:
  ms->matchdepth = ms->matchdepth + 1;
  return (char *)pbVar5;
}

Assistant:

static const char *match (MatchState *ms, const char *s, const char *p) {
  if (ms->matchdepth-- == 0)
    luaL_error(ms->L, "pattern too complex");
  init: /* using goto's to optimize tail recursion */
  if (p != ms->p_end) {  /* end of pattern? */
    switch (*p) {
      case '(': {  /* start capture */
        if (*(p + 1) == ')')  /* position capture? */
          s = start_capture(ms, s, p + 2, CAP_POSITION);
        else
          s = start_capture(ms, s, p + 1, CAP_UNFINISHED);
        break;
      }
      case ')': {  /* end capture */
        s = end_capture(ms, s, p + 1);
        break;
      }
      case '$': {
        if ((p + 1) != ms->p_end)  /* is the '$' the last char in pattern? */
          goto dflt;  /* no; go to default */
        s = (s == ms->src_end) ? s : NULL;  /* check end of string */
        break;
      }
      case L_ESC: {  /* escaped sequences not in the format class[*+?-]? */
        switch (*(p + 1)) {
          case 'b': {  /* balanced string? */
            s = matchbalance(ms, s, p + 2);
            if (s != NULL) {
              p += 4; goto init;  /* return match(ms, s, p + 4); */
            }  /* else fail (s == NULL) */
            break;
          }
          case 'f': {  /* frontier? */
            const char *ep; char previous;
            p += 2;
            if (*p != '[')
              luaL_error(ms->L, "missing '[' after '%%f' in pattern");
            ep = classend(ms, p);  /* points to what is next */
            previous = (s == ms->src_init) ? '\0' : *(s - 1);
            if (!matchbracketclass(uchar(previous), p, ep - 1) &&
               matchbracketclass(uchar(*s), p, ep - 1)) {
              p = ep; goto init;  /* return match(ms, s, ep); */
            }
            s = NULL;  /* match failed */
            break;
          }
          case '0': case '1': case '2': case '3':
          case '4': case '5': case '6': case '7':
          case '8': case '9': {  /* capture results (%0-%9)? */
            s = match_capture(ms, s, uchar(*(p + 1)));
            if (s != NULL) {
              p += 2; goto init;  /* return match(ms, s, p + 2) */
            }
            break;
          }
          default: goto dflt;
        }
        break;
      }
      default: dflt: {  /* pattern class plus optional suffix */
        const char *ep = classend(ms, p);  /* points to optional suffix */
        /* does not match at least once? */
        if (!singlematch(ms, s, p, ep)) {
          if (*ep == '*' || *ep == '?' || *ep == '-') {  /* accept empty? */
            p = ep + 1; goto init;  /* return match(ms, s, ep + 1); */
          }
          else  /* '+' or no suffix */
            s = NULL;  /* fail */
        }
        else {  /* matched once */
          switch (*ep) {  /* handle optional suffix */
            case '?': {  /* optional */
              const char *res;
              if ((res = match(ms, s + 1, ep + 1)) != NULL)
                s = res;
              else {
                p = ep + 1; goto init;  /* else return match(ms, s, ep + 1); */
              }
              break;
            }
            case '+':  /* 1 or more repetitions */
              s++;  /* 1 match already done */
              /* FALLTHROUGH */
            case '*':  /* 0 or more repetitions */
              s = max_expand(ms, s, p, ep);
              break;
            case '-':  /* 0 or more repetitions (minimum) */
              s = min_expand(ms, s, p, ep);
              break;
            default:  /* no suffix */
              s++; p = ep; goto init;  /* return match(ms, s + 1, ep); */
          }
        }
        break;
      }
    }
  }
  ms->matchdepth++;
  return s;
}